

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

size_t tinyusdz::anon_unknown_0::_DecompressIntegers<unsigned_long>
                 (char *compressed,size_t compressedSize,unsigned_long *ints,size_t numInts,
                 string *err,char *workingSpace)

{
  char *__p;
  size_t sVar1;
  size_t decompSz;
  unique_ptr<char[],_std::default_delete<char[]>_> tmpSpace;
  size_t workingSpaceSize;
  char *workingSpace_local;
  string *err_local;
  size_t numInts_local;
  unsigned_long *ints_local;
  size_t compressedSize_local;
  char *compressed_local;
  
  tmpSpace._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(numInts);
  ::std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<std::default_delete<char[]>,void>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&decompSz);
  workingSpaceSize = (size_t)workingSpace;
  if (workingSpace == (char *)0x0) {
    __p = (char *)operator_new__((ulong)tmpSpace._M_t.
                                        super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                        .super__Head_base<0UL,_char_*,_false>._M_head_impl);
    ::std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&decompSz,__p);
    workingSpaceSize =
         (size_t)::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)&decompSz);
  }
  sVar1 = LZ4Compression::DecompressFromBuffer
                    (compressed,(char *)workingSpaceSize,compressedSize,
                     (size_t)tmpSpace._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
                             ._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl,err);
  if (sVar1 == 0) {
    compressed_local = (char *)0x0;
  }
  else {
    compressed_local = (char *)_DecodeIntegers<unsigned_long>((char *)workingSpaceSize,numInts,ints)
    ;
  }
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&decompSz);
  return (size_t)compressed_local;
}

Assistant:

size_t _DecompressIntegers(char const *compressed, size_t compressedSize,
                           Int *ints, size_t numInts, std::string *err, char *workingSpace)
{
    // Working space.
    size_t workingSpaceSize =
        Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(numInts);
    std::unique_ptr<char[]> tmpSpace;
    if (!workingSpace) {
        tmpSpace.reset(new char[workingSpaceSize]);
        workingSpace = tmpSpace.get();
    }

    size_t decompSz = LZ4Compression::DecompressFromBuffer(
        compressed, workingSpace, compressedSize, workingSpaceSize, err);

    if (decompSz == 0)
        return 0;

    return _DecodeIntegers(workingSpace, numInts, ints);
}